

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          uint num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<3> f)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  f_00;
  wchar_t wVar1;
  alignment aVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint in_ESI;
  bin_writer<3> in_R8;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *in_R9;
  align_spec as;
  size_t padding;
  char_type fill;
  size_t size;
  undefined7 in_stack_ffffffffffffff91;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar9;
  basic_string_view<char> local_10;
  
  sVar5 = basic_string_view<char>::size(&local_10);
  uVar6 = sVar5 + in_ESI;
  wVar1 = align_spec::fill((align_spec *)in_R8);
  uVar9 = (undefined1)wVar1;
  sVar5 = 0;
  aVar2 = align_spec::align((align_spec *)in_R8);
  if (aVar2 == ALIGN_NUMERIC) {
    uVar3 = align_spec::width((align_spec *)in_R8);
    if (uVar6 < uVar3) {
      uVar3 = align_spec::width((align_spec *)in_R8);
      sVar5 = uVar3 - uVar6;
      uVar3 = align_spec::width((align_spec *)in_R8);
      uVar6 = (ulong)uVar3;
    }
  }
  else {
    iVar4 = basic_format_specs<char>::precision((basic_format_specs<char> *)in_R8);
    if ((int)in_ESI < iVar4) {
      sVar5 = basic_string_view<char>::size(&local_10);
      iVar4 = basic_format_specs<char>::precision((basic_format_specs<char> *)in_R8);
      uVar6 = sVar5 + (long)iVar4;
      iVar4 = basic_format_specs<char>::precision((basic_format_specs<char> *)in_R8);
      sVar5 = (long)iVar4 - (ulong)in_ESI;
      uVar9 = 0x30;
    }
  }
  uVar7 = (undefined4)((ulong)*(undefined8 *)in_R8 >> 0x20);
  uVar8 = *(undefined4 *)((long)in_R8 + 8);
  aVar2 = align_spec::align((align_spec *)in_R8);
  if (aVar2 == ALIGN_DEFAULT) {
    uVar8 = 2;
  }
  f_00.prefix.data_._4_4_ = uVar8;
  f_00.prefix.data_._0_4_ = uVar7;
  f_00.prefix.size_ = sVar5;
  f_00._16_7_ = in_stack_ffffffffffffffc0;
  f_00._23_1_ = uVar9;
  f_00.padding = uVar6;
  f_00.f = in_R8;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
            (in_R9,sVar5,(align_spec *)CONCAT71(in_stack_ffffffffffffff91,uVar9),f_00);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }